

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O1

int secp256k1_musig_aggnonce_parse
              (secp256k1_context *ctx,secp256k1_musig_aggnonce *nonce,uchar *in66)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uchar *p2;
  uchar *puVar7;
  long lVar8;
  bool bVar9;
  secp256k1_ge ges [2];
  byte local_108 [48];
  secp256k1_ge local_d8 [2];
  
  if (nonce == (secp256k1_musig_aggnonce *)0x0) {
    secp256k1_musig_aggnonce_parse_cold_2();
  }
  else {
    if (in66 != (uchar *)0x0) {
      puVar7 = in66;
      lVar8 = 0;
      do {
        uVar4 = lVar8 * 0x58;
        local_108[0x10] = 0;
        local_108[0x11] = 0;
        local_108[0x12] = 0;
        local_108[0x13] = 0;
        local_108[0x14] = 0;
        local_108[0x15] = 0;
        local_108[0x16] = 0;
        local_108[0x17] = 0;
        local_108[0x18] = 0;
        local_108[0x19] = 0;
        local_108[0x1a] = 0;
        local_108[0x1b] = 0;
        local_108[0x1c] = 0;
        local_108[0x1d] = 0;
        local_108[0x1e] = 0;
        local_108[0x1f] = 0;
        local_108[0] = 0;
        local_108[1] = 0;
        local_108[2] = 0;
        local_108[3] = 0;
        local_108[4] = 0;
        local_108[5] = 0;
        local_108[6] = 0;
        local_108[7] = 0;
        local_108[8] = 0;
        local_108[9] = 0;
        local_108[10] = 0;
        local_108[0xb] = 0;
        local_108[0xc] = 0;
        local_108[0xd] = 0;
        local_108[0xe] = 0;
        local_108[0xf] = 0;
        local_108[0x20] = 0;
        lVar5 = 0;
        do {
          uVar6 = uVar4 & 0xffffffff;
          bVar1 = puVar7[lVar5];
          bVar2 = local_108[lVar5];
          uVar4 = (ulong)((uint)bVar1 - (uint)bVar2);
          if (bVar1 == bVar2) {
            uVar4 = uVar6;
          }
          iVar3 = (int)uVar4;
          if (bVar1 != bVar2) goto LAB_00110ee8;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x21);
        iVar3 = 0;
LAB_00110ee8:
        if (iVar3 == 0) {
          local_d8[lVar8].infinity = 1;
          local_d8[lVar8].x.n[0] = 0;
          local_d8[lVar8].x.n[1] = 0;
          local_d8[lVar8].x.n[2] = 0;
          local_d8[lVar8].x.n[3] = 0;
          local_d8[lVar8].x.n[4] = 0;
          local_d8[lVar8].y.n[0] = 0;
          local_d8[lVar8].y.n[1] = 0;
          local_d8[lVar8].y.n[2] = 0;
          local_d8[lVar8].y.n[3] = 0;
          local_d8[lVar8].y.n[4] = 0;
        }
        else {
          iVar3 = secp256k1_eckey_pubkey_parse(local_d8 + lVar8,in66 + lVar8 * 0x21,0x21);
          if (iVar3 == 0) {
            return 0;
          }
        }
        puVar7 = puVar7 + 0x21;
        bVar9 = lVar8 != 0;
        lVar8 = lVar8 + 1;
        if (bVar9) {
          secp256k1_musig_aggnonce_save(nonce,local_d8);
          return 1;
        }
      } while( true );
    }
    secp256k1_musig_aggnonce_parse_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_musig_aggnonce_parse(const secp256k1_context* ctx, secp256k1_musig_aggnonce* nonce, const unsigned char *in66) {
    secp256k1_ge ges[2];
    int i;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(nonce != NULL);
    ARG_CHECK(in66 != NULL);

    for (i = 0; i < 2; i++) {
        if (!secp256k1_musig_ge_parse_ext(&ges[i], &in66[33*i])) {
            return 0;
        }
    }
    secp256k1_musig_aggnonce_save(nonce, ges);
    return 1;
}